

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginBlock
          (WatWriter *this,LabelType label_type,Block *block,char *text)

{
  byte bVar1;
  Index IVar2;
  bool has_label;
  char *text_local;
  Block *block_local;
  WatWriter *pWStack_10;
  LabelType label_type_local;
  WatWriter *this_local;
  
  block_local._4_4_ = label_type;
  pWStack_10 = this;
  WritePutsSpace(this,text);
  bVar1 = std::__cxx11::string::empty((string *)block);
  bVar1 = (bVar1 ^ 0xff) & 1;
  if (bVar1 != 0) {
    WriteString(this,&block->label,Space);
  }
  WriteTypes(this,&(block->decl).sig.param_types,"param");
  WriteTypes(this,&(block->decl).sig.result_types,"result");
  if (bVar1 == 0) {
    IVar2 = GetLabelStackSize(this);
    Writef(this," ;; label = @%u",(ulong)IVar2);
  }
  WriteNewline(this,true);
  std::vector<wabt::(anonymous_namespace)::Label,std::allocator<wabt::(anonymous_namespace)::Label>>
  ::
  emplace_back<wabt::LabelType&,std::__cxx11::string_const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&>
            ((vector<wabt::(anonymous_namespace)::Label,std::allocator<wabt::(anonymous_namespace)::Label>>
              *)&this->label_stack_,(LabelType *)((long)&block_local + 4),&block->label,
             &(block->decl).sig.param_types,&(block->decl).sig.result_types);
  Indent(this);
  return;
}

Assistant:

void WatWriter::WriteBeginBlock(LabelType label_type,
                                const Block& block,
                                const char* text) {
  WritePutsSpace(text);
  bool has_label = !block.label.empty();
  if (has_label) {
    WriteString(block.label, NextChar::Space);
  }
  WriteTypes(block.decl.sig.param_types, "param");
  WriteTypes(block.decl.sig.result_types, "result");
  if (!has_label) {
    Writef(" ;; label = @%" PRIindex, GetLabelStackSize());
  }
  WriteNewline(FORCE_NEWLINE);
  label_stack_.emplace_back(label_type, block.label, block.decl.sig.param_types,
                            block.decl.sig.result_types);
  Indent();
}